

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O1

void forwardMessageCMD(packet_t *recv)

{
  size_type *psVar1;
  uint uVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  ostream *poVar6;
  char *__s;
  uint uVar7;
  ulong *puVar8;
  long *plVar9;
  ulong uVar10;
  string *extraout_RDX;
  string *extraout_RDX_00;
  string *psVar11;
  undefined8 uVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  int msgLength;
  string __str_2;
  string msg;
  string __str_1;
  string dst;
  string __str;
  int f4;
  int f3;
  int f2;
  string __str_3;
  int f1;
  long *local_190;
  string *local_188;
  long local_180;
  undefined8 uStack_178;
  uint local_16c;
  ulong *local_168;
  long local_160;
  ulong local_158;
  long lStack_150;
  ulong *local_148;
  long local_140;
  ulong local_138 [2];
  string local_128;
  ulong *local_108;
  long local_100;
  ulong local_f8;
  long lStack_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  undefined8 uStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8 [2];
  routerip_t local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  uint local_34;
  
  local_16c = 0;
  __isoc99_sscanf((recv->_M_dataplus)._M_p,"%*s %d.%d.%d.%d %d",&local_34,&local_5c,&local_60,
                  &local_64,&local_16c);
  uVar2 = -local_34;
  if (0 < (int)local_34) {
    uVar2 = local_34;
  }
  uVar13 = 1;
  if (9 < uVar2) {
    uVar10 = (ulong)uVar2;
    uVar14 = 4;
    do {
      uVar13 = uVar14;
      uVar7 = (uint)uVar10;
      if (uVar7 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_0010640b;
      }
      if (uVar7 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_0010640b;
      }
      if (uVar7 < 10000) goto LAB_0010640b;
      uVar10 = uVar10 / 10000;
      uVar14 = uVar13 + 4;
    } while (99999 < uVar7);
    uVar13 = uVar13 + 1;
  }
LAB_0010640b:
  local_88 = &local_78;
  std::__cxx11::string::_M_construct((ulong)&local_88,(char)uVar13 - (char)((int)local_34 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_88 + (ulong)(local_34 >> 0x1f)),uVar13,uVar2);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_88);
  local_108 = &local_f8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_f8 = *puVar8;
    lStack_f0 = plVar4[3];
  }
  else {
    local_f8 = *puVar8;
    local_108 = (ulong *)*plVar4;
  }
  local_100 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar2 = -local_5c;
  if (0 < (int)local_5c) {
    uVar2 = local_5c;
  }
  uVar13 = 1;
  if (9 < uVar2) {
    uVar10 = (ulong)uVar2;
    uVar14 = 4;
    do {
      uVar13 = uVar14;
      uVar7 = (uint)uVar10;
      if (uVar7 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_00106509;
      }
      if (uVar7 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_00106509;
      }
      if (uVar7 < 10000) goto LAB_00106509;
      uVar10 = uVar10 / 10000;
      uVar14 = uVar13 + 4;
    } while (99999 < uVar7);
    uVar13 = uVar13 + 1;
  }
LAB_00106509:
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct((ulong)&local_c8,(char)uVar13 - (char)((int)local_5c >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(local_5c >> 0x1f) + (long)local_c8),uVar13,uVar2);
  uVar10 = 0xf;
  if (local_108 != &local_f8) {
    uVar10 = local_f8;
  }
  if (uVar10 < (ulong)(local_c0 + local_100)) {
    uVar10 = 0xf;
    if (local_c8 != local_b8) {
      uVar10 = local_b8[0];
    }
    if (uVar10 < (ulong)(local_c0 + local_100)) goto LAB_001065a3;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_108);
  }
  else {
LAB_001065a3:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_c8);
  }
  local_e8 = &local_d8;
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_d8 = *puVar8;
    uStack_d0 = puVar5[3];
  }
  else {
    local_d8 = *puVar8;
    local_e8 = (ulong *)*puVar5;
  }
  local_e0 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_e8);
  local_168 = &local_158;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_158 = *puVar8;
    lStack_150 = plVar4[3];
  }
  else {
    local_158 = *puVar8;
    local_168 = (ulong *)*plVar4;
  }
  local_160 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar2 = -local_60;
  if (0 < (int)local_60) {
    uVar2 = local_60;
  }
  uVar13 = 1;
  if (9 < uVar2) {
    uVar10 = (ulong)uVar2;
    uVar14 = 4;
    do {
      uVar13 = uVar14;
      uVar7 = (uint)uVar10;
      if (uVar7 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_001066dc;
      }
      if (uVar7 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_001066dc;
      }
      if (uVar7 < 10000) goto LAB_001066dc;
      uVar10 = uVar10 / 10000;
      uVar14 = uVar13 + 4;
    } while (99999 < uVar7);
    uVar13 = uVar13 + 1;
  }
LAB_001066dc:
  local_148 = local_138;
  std::__cxx11::string::_M_construct((ulong)&local_148,(char)uVar13 - (char)((int)local_60 >> 0x1f))
  ;
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(local_60 >> 0x1f) + (long)local_148),uVar13,uVar2);
  uVar10 = 0xf;
  if (local_168 != &local_158) {
    uVar10 = local_158;
  }
  if (uVar10 < (ulong)(local_140 + local_160)) {
    uVar10 = 0xf;
    if (local_148 != local_138) {
      uVar10 = local_138[0];
    }
    if (uVar10 < (ulong)(local_140 + local_160)) goto LAB_00106755;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,(ulong)local_168);
  }
  else {
LAB_00106755:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_148);
  }
  local_190 = &local_180;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_180 = *plVar4;
    uStack_178 = puVar5[3];
  }
  else {
    local_180 = *plVar4;
    local_190 = (long *)*puVar5;
  }
  local_188 = (string *)puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_190);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_128.field_2._M_allocated_capacity = *puVar8;
    local_128.field_2._8_8_ = plVar4[3];
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  }
  else {
    local_128.field_2._M_allocated_capacity = *puVar8;
    local_128._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_128._M_string_length = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar2 = -local_64;
  if (0 < (int)local_64) {
    uVar2 = local_64;
  }
  uVar13 = 1;
  if (9 < uVar2) {
    uVar10 = (ulong)uVar2;
    uVar14 = 4;
    do {
      uVar13 = uVar14;
      uVar7 = (uint)uVar10;
      if (uVar7 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_0010687f;
      }
      if (uVar7 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_0010687f;
      }
      if (uVar7 < 10000) goto LAB_0010687f;
      uVar10 = uVar10 / 10000;
      uVar14 = uVar13 + 4;
    } while (99999 < uVar7);
    uVar13 = uVar13 + 1;
  }
LAB_0010687f:
  local_58 = local_48;
  std::__cxx11::string::_M_construct((ulong)&local_58,(char)uVar13 - (char)((int)local_64 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(local_64 >> 0x1f) + (long)local_58),uVar13,uVar2);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    uVar12 = local_128.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_50 + local_128._M_string_length) {
    uVar10 = 0xf;
    if (local_58 != local_48) {
      uVar10 = local_48[0];
    }
    if (uVar10 < local_50 + local_128._M_string_length) goto LAB_00106918;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_58,0,(char *)0x0,(ulong)local_128._M_dataplus._M_p);
  }
  else {
LAB_00106918:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_58);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  psVar1 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_a8.field_2._M_allocated_capacity = *psVar1;
    local_a8.field_2._8_8_ = puVar5[3];
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar1;
    local_a8._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_a8._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_148 != local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  if (local_168 != &local_158) {
    operator_delete(local_168,local_158 + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,local_f8 + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"frwd","");
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
  plVar9 = plVar4 + 2;
  if ((long *)*plVar4 == plVar9) {
    local_78 = *plVar9;
    lStack_70 = plVar4[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar9;
    local_88 = (long *)*plVar4;
  }
  local_80 = plVar4[1];
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_88,(ulong)local_a8._M_dataplus._M_p);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_f8 = *puVar8;
    lStack_f0 = plVar4[3];
    local_108 = &local_f8;
  }
  else {
    local_f8 = *puVar8;
    local_108 = (ulong *)*plVar4;
  }
  local_100 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_108);
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_d8 = *puVar8;
    uStack_d0 = puVar5[3];
    local_e8 = &local_d8;
  }
  else {
    local_d8 = *puVar8;
    local_e8 = (ulong *)*puVar5;
  }
  local_e0 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  uVar2 = -local_16c;
  if (0 < (int)local_16c) {
    uVar2 = local_16c;
  }
  uVar13 = 1;
  if (9 < uVar2) {
    uVar10 = (ulong)uVar2;
    uVar14 = 4;
    do {
      uVar13 = uVar14;
      uVar7 = (uint)uVar10;
      if (uVar7 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_00106c4e;
      }
      if (uVar7 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_00106c4e;
      }
      if (uVar7 < 10000) goto LAB_00106c4e;
      uVar10 = uVar10 / 10000;
      uVar14 = uVar13 + 4;
    } while (99999 < uVar7);
    uVar13 = uVar13 + 1;
  }
LAB_00106c4e:
  uVar14 = local_16c >> 0x1f;
  local_148 = local_138;
  std::__cxx11::string::_M_construct
            ((ulong)&local_148,(char)uVar13 - (char)((int)local_16c >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)uVar14 + (long)local_148),uVar13,uVar2);
  uVar10 = 0xf;
  if (local_e8 != &local_d8) {
    uVar10 = local_d8;
  }
  if (uVar10 < (ulong)(local_140 + local_e0)) {
    uVar10 = 0xf;
    if (local_148 != local_138) {
      uVar10 = local_138[0];
    }
    if ((ulong)(local_140 + local_e0) <= uVar10) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,(ulong)local_e8);
      goto LAB_00106d01;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_148);
LAB_00106d01:
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_158 = *puVar8;
    lStack_150 = puVar5[3];
    local_168 = &local_158;
  }
  else {
    local_158 = *puVar8;
    local_168 = (ulong *)*puVar5;
  }
  local_160 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_180 = *plVar4;
    uStack_178 = puVar5[3];
    local_190 = &local_180;
  }
  else {
    local_180 = *plVar4;
    local_190 = (long *)*puVar5;
  }
  local_188 = (string *)puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  std::__cxx11::string::substr((ulong)&local_128,(ulong)recv);
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_168 != &local_158) {
    operator_delete(local_168,local_158 + 1);
  }
  if (local_148 != local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,local_f8 + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  local_190 = &local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"frwd","");
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_190,(long)local_188);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"> ",2);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_a8._M_dataplus._M_p,local_a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,local_16c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_128._M_dataplus._M_p,local_128._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  __s = inet_ntoa((in_addr)socketLocal.socketAddr.sin_addr.s_addr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,__s,(allocator<char> *)&local_168);
  psVar11 = (string *)local_a8._M_string_length;
  if ((string *)local_a8._M_string_length == local_188) {
    if ((string *)local_a8._M_string_length == (string *)0x0) {
      bVar15 = true;
    }
    else {
      iVar3 = bcmp(local_a8._M_dataplus._M_p,local_190,local_a8._M_string_length);
      bVar15 = iVar3 == 0;
      psVar11 = extraout_RDX;
    }
  }
  else {
    bVar15 = false;
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
    psVar11 = extraout_RDX_00;
  }
  if (bVar15) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_128._M_dataplus._M_p,local_128._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," packet reached destination (printed by ",0x28);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  else {
    forwardMessageToNextHop(&local_a8,&local_128,psVar11);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void forwardMessageCMD(const packet_t &recv) {
	int f1, f2, f3, f4;
	int msgLength = 0;
	sscanf(recv.data(), "%*s %d.%d.%d.%d %d", &f1, &f2, &f3, &f4, &msgLength);
	string dst = to_string(f1) + "." + to_string(f2) + "." + to_string(f3) + "." + to_string(f4);
	string msg = recv.substr((FORWARD_MESSAGE + " " + dst + " " + to_string(msgLength) + " ").length(),
	                         static_cast<unsigned long>(msgLength));
	cout << FORWARD_MESSAGE << "> " << dst << " " << msgLength << " " << msg << endl;
	if (dst == socketLocal.getLocalIP()) {
		cout << "{" << msg << "}" << " packet reached destination (printed by " << dst << ")" << endl;;
	} else
		forwardMessageToNextHop(dst, msg, recv);
}